

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataSocket.cpp
# Opt level: O2

bool __thiscall brynet::net::DataSocket::onEnterEventLoop(DataSocket *this,PTR *eventLoop)

{
  EventLoop *this_00;
  uint __line;
  bool bVar1;
  sock sVar2;
  char *__assertion;
  
  bVar1 = EventLoop::isInLoopThread
                    ((eventLoop->
                     super___shared_ptr<brynet::net::EventLoop,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
  ;
  if (!bVar1) {
    __assertion = "eventLoop->isInLoopThread()";
    __line = 0x48;
LAB_0012c5c1:
    __assert_fail(__assertion,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dyu[P]brynet/src/brynet/net/DataSocket.cpp"
                  ,__line,"bool brynet::net::DataSocket::onEnterEventLoop(const EventLoop::PTR &)");
  }
  bVar1 = EventLoop::isInLoopThread
                    ((eventLoop->
                     super___shared_ptr<brynet::net::EventLoop,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
  ;
  if (bVar1) {
    if ((this->mEventLoop).super___shared_ptr<brynet::net::EventLoop,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr != (element_type *)0x0) {
      __assertion = "mEventLoop == nullptr";
      __line = 0x4d;
      goto LAB_0012c5c1;
    }
    std::__shared_ptr<brynet::net::EventLoop,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->mEventLoop).
                super___shared_ptr<brynet::net::EventLoop,_(__gnu_cxx::_Lock_policy)2>,
               &eventLoop->super___shared_ptr<brynet::net::EventLoop,_(__gnu_cxx::_Lock_policy)2>);
    sVar2 = TcpSocket::getFD((this->mSocket)._M_t.
                             super___uniq_ptr_impl<brynet::net::TcpSocket,_brynet::net::TcpSocket::TcpSocketDeleter>
                             ._M_t.
                             super__Tuple_impl<0UL,_brynet::net::TcpSocket_*,_brynet::net::TcpSocket::TcpSocketDeleter>
                             .super__Head_base<0UL,_brynet::net::TcpSocket_*,_false>._M_head_impl);
    bVar1 = base::SocketNonblock(sVar2);
    if (bVar1) {
      this_00 = (this->mEventLoop).
                super___shared_ptr<brynet::net::EventLoop,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      sVar2 = TcpSocket::getFD((this->mSocket)._M_t.
                               super___uniq_ptr_impl<brynet::net::TcpSocket,_brynet::net::TcpSocket::TcpSocketDeleter>
                               ._M_t.
                               super__Tuple_impl<0UL,_brynet::net::TcpSocket_*,_brynet::net::TcpSocket::TcpSocketDeleter>
                               .super__Head_base<0UL,_brynet::net::TcpSocket_*,_false>._M_head_impl)
      ;
      bVar1 = EventLoop::linkChannel(this_00,sVar2,&this->super_Channel);
      if (bVar1) {
        if ((this->mEnterCallback).super__Function_base._M_manager == (_Manager_type)0x0) {
          return true;
        }
        std::function<void_(brynet::net::DataSocket_*)>::operator()(&this->mEnterCallback,this);
        std::function<void_(brynet::net::DataSocket_*)>::operator=
                  (&this->mEnterCallback,(nullptr_t)0x0);
        return true;
      }
    }
    closeSocket(this);
  }
  return false;
}

Assistant:

bool DataSocket::onEnterEventLoop(const EventLoop::PTR& eventLoop)
{
    assert(eventLoop->isInLoopThread());
    if (!eventLoop->isInLoopThread())
    {
        return false;
    }
    assert(mEventLoop == nullptr);
    if (mEventLoop != nullptr)
    {
        return false;
    }

    mEventLoop = eventLoop;

    if (!brynet::net::base::SocketNonblock(mSocket->getFD()))
    {
        closeSocket();
        return false;
    }
    if (!mEventLoop->linkChannel(mSocket->getFD(), this))
    {
        closeSocket();
        return false;
    }

#ifdef USE_OPENSSL
    if (mSSL != nullptr)
    {
        processSSLHandshake();
        return true;
    }
#endif

    if (!checkRead())
    {
        closeSocket();
        return false;
    }

    if (mEnterCallback != nullptr)
    {
        mEnterCallback(this);
        mEnterCallback = nullptr;
    }

    return true;
}